

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_entryhi_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  uint uVar1;
  uint uVar2;
  CPUState *cpu;
  uint local_20;
  target_ulong_conflict mask;
  target_ulong_conflict val;
  target_ulong_conflict old;
  target_ulong_conflict arg1_local;
  CPUMIPSState *env_local;
  
  local_20 = env->CP0_EntryHi_ASID_mask | 0xffffe000;
  if (1 < (env->CP0_Config4 >> 0x1d & 3U)) {
    local_20 = env->CP0_EntryHi_ASID_mask | 0xffffe400;
  }
  uVar1 = env->CP0_EntryHi;
  uVar2 = arg1 & local_20 | uVar1 & (local_20 ^ 0xffffffff);
  env->CP0_EntryHi = uVar2;
  if ((env->CP0_Config3 & 4U) != 0) {
    sync_c0_entryhi(env,env->current_tc);
  }
  if ((uVar1 & env->CP0_EntryHi_ASID_mask) != (uVar2 & env->CP0_EntryHi_ASID_mask)) {
    cpu = env_cpu(env);
    tlb_flush_mips(cpu);
  }
  return;
}

Assistant:

void helper_mtc0_entryhi(CPUMIPSState *env, target_ulong arg1)
{
    target_ulong old, val, mask;
    mask = (TARGET_PAGE_MASK << 1) | env->CP0_EntryHi_ASID_mask;
    if (((env->CP0_Config4 >> CP0C4_IE) & 0x3) >= 2) {
        mask |= 1 << CP0EnHi_EHINV;
    }

    /* 1k pages not implemented */
#if defined(TARGET_MIPS64)
    if (env->insn_flags & ISA_MIPS32R6) {
        int entryhi_r = extract64(arg1, 62, 2);
        int config0_at = extract32(env->CP0_Config0, 13, 2);
        bool no_supervisor = (env->CP0_Status_rw_bitmask & 0x8) == 0;
        if ((entryhi_r == 2) ||
            (entryhi_r == 1 && (no_supervisor || config0_at == 1))) {
            /* skip EntryHi.R field if new value is reserved */
            mask &= ~(0x3ull << 62);
        }
    }
    mask &= env->SEGMask;
#endif
    old = env->CP0_EntryHi;
    val = (arg1 & mask) | (old & ~mask);
    env->CP0_EntryHi = val;
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        sync_c0_entryhi(env, env->current_tc);
    }
    /* If the ASID changes, flush qemu's TLB.  */
    if ((old & env->CP0_EntryHi_ASID_mask) !=
        (val & env->CP0_EntryHi_ASID_mask)) {
        tlb_flush(env_cpu(env));
    }
}